

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

AppleSDK __thiscall cmMakefile::GetAppleSDKType(cmMakefile *this)

{
  bool bVar1;
  string *psVar2;
  long lVar3;
  bool bVar4;
  string_view sVar5;
  GetAppleSDKType__ *local_2d0;
  allocator<char> local_219;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  string_view local_1d8;
  string_view local_1c8;
  anon_struct_40_2_65dcf250 *local_1b8;
  anon_struct_40_2_65dcf250 *entry;
  anon_struct_40_2_65dcf250 *__end1;
  anon_struct_40_2_65dcf250 *__begin1;
  anon_struct_40_2_65dcf250 (*__range1) [6];
  string *local_190;
  undefined1 local_188 [8];
  anon_struct_40_2_65dcf250 sdkDatabase [6];
  string local_90;
  allocator<char> local_59;
  string local_58;
  undefined1 local_38 [8];
  string sdkRoot;
  cmMakefile *this_local;
  
  sdkRoot.field_2._8_8_ = this;
  std::__cxx11::string::string((string *)local_38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"CMAKE_OSX_SYSROOT",&local_59);
  psVar2 = GetSafeDefinition(this,&local_58);
  std::__cxx11::string::operator=((string *)local_38,(string *)psVar2);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  cmsys::SystemTools::LowerCase(&local_90,(string *)local_38);
  std::__cxx11::string::operator=((string *)local_38,(string *)&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  __range1._1_1_ = 1;
  local_190 = (string *)local_188;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_188,"appletvos",(allocator<char> *)((long)&__range1 + 7));
  sdkDatabase[0].name.field_2._8_4_ = 3;
  local_190 = (string *)&sdkDatabase[0].sdk;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sdkDatabase[0].sdk,"appletvsimulator",
             (allocator<char> *)((long)&__range1 + 6));
  sdkDatabase[1].name.field_2._8_4_ = 4;
  local_190 = (string *)&sdkDatabase[1].sdk;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sdkDatabase[1].sdk,"iphoneos",(allocator<char> *)((long)&__range1 + 5));
  sdkDatabase[2].name.field_2._8_4_ = 1;
  local_190 = (string *)&sdkDatabase[2].sdk;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sdkDatabase[2].sdk,"iphonesimulator",
             (allocator<char> *)((long)&__range1 + 4));
  sdkDatabase[3].name.field_2._8_4_ = 2;
  local_190 = (string *)&sdkDatabase[3].sdk;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sdkDatabase[3].sdk,"watchos",(allocator<char> *)((long)&__range1 + 3));
  sdkDatabase[4].name.field_2._8_4_ = 5;
  local_190 = (string *)&sdkDatabase[4].sdk;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sdkDatabase[4].sdk,"watchsimulator",(allocator<char> *)((long)&__range1 + 2)
            );
  sdkDatabase[5].name.field_2._8_4_ = 6;
  __range1._1_1_ = 0;
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 2));
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 3));
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 4));
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 5));
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 6));
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
  __end1 = (anon_struct_40_2_65dcf250 *)local_188;
  entry = (anon_struct_40_2_65dcf250 *)&sdkDatabase[5].sdk;
  __begin1 = __end1;
  do {
    if (__end1 == entry) {
      this_local._4_4_ = MacOS;
LAB_001fdbc9:
      local_2d0 = (GetAppleSDKType__ *)&sdkDatabase[5].sdk;
      do {
        local_2d0 = local_2d0 + -0x28;
        GetAppleSDKType()::~__0(local_2d0);
      } while (local_2d0 != (GetAppleSDKType__ *)local_188);
      std::__cxx11::string::~string((string *)local_38);
      return this_local._4_4_;
    }
    local_1b8 = __end1;
    sVar5 = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_38);
    local_1c8 = sVar5;
    sVar5 = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_1b8);
    local_1d8 = sVar5;
    bVar1 = cmHasPrefix(local_1c8,sVar5);
    bVar4 = true;
    if (!bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_218,"/",&local_219);
      std::operator+(&local_1f8,&local_218,&local_1b8->name);
      lVar3 = std::__cxx11::string::find((string *)local_38,(ulong)&local_1f8);
      bVar4 = lVar3 != -1;
      std::__cxx11::string::~string((string *)&local_1f8);
      std::__cxx11::string::~string((string *)&local_218);
      std::allocator<char>::~allocator(&local_219);
    }
    if (bVar4) {
      this_local._4_4_ = local_1b8->sdk;
      goto LAB_001fdbc9;
    }
    __end1 = __end1 + 1;
  } while( true );
}

Assistant:

cmMakefile::AppleSDK cmMakefile::GetAppleSDKType() const
{
  std::string sdkRoot;
  sdkRoot = this->GetSafeDefinition("CMAKE_OSX_SYSROOT");
  sdkRoot = cmSystemTools::LowerCase(sdkRoot);

  struct
  {
    std::string name;
    AppleSDK sdk;
  } const sdkDatabase[]{
    { "appletvos", AppleSDK::AppleTVOS },
    { "appletvsimulator", AppleSDK::AppleTVSimulator },
    { "iphoneos", AppleSDK::IPhoneOS },
    { "iphonesimulator", AppleSDK::IPhoneSimulator },
    { "watchos", AppleSDK::WatchOS },
    { "watchsimulator", AppleSDK::WatchSimulator },
  };

  for (auto const& entry : sdkDatabase) {
    if (cmHasPrefix(sdkRoot, entry.name) ||
        sdkRoot.find(std::string("/") + entry.name) != std::string::npos) {
      return entry.sdk;
    }
  }

  return AppleSDK::MacOS;
}